

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerator::Logger::Error(Logger *this,GenT genType,string *message)

{
  string *__lhs;
  lock_guard<std::mutex> lock;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  __lhs = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  std::operator+(&local_50,__lhs," error");
  HeadLine(&local_30,&local_50);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((string *)&msg);
  if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&msg);
  }
  std::__cxx11::string::push_back((char)&msg);
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stderr(&msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Error(GenT genType,
                                      std::string const& message) const
{
  std::string msg;
  msg += HeadLine(GeneratorName(genType) + " error");
  // Message
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stderr(msg);
  }
}